

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Float __thiscall
pbrt::PaddedSobolSampler::generateSample
          (PaddedSobolSampler *this,span<const_unsigned_int> C,uint32_t a,uint32_t hash)

{
  int iVar1;
  span<const_unsigned_int> C_00;
  span<const_unsigned_int> C_01;
  undefined4 in_ECX;
  undefined8 in_RDX;
  size_t in_RSI;
  long in_RDI;
  uint32_t in_R8D;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  LogLevel in_stack_00000044;
  OwenScrambler local_6c [3];
  undefined8 in_stack_ffffffffffffffa0;
  uint *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  Float local_4;
  
  iVar1 = *(int *)(in_RDI + 4);
  if (iVar1 == 0) {
    local_4 = SampleGeneratorMatrix<pbrt::NoRandomizer>(in_RSI,in_RDX,in_ECX);
  }
  else if (iVar1 == 2) {
    XORScrambler::XORScrambler((XORScrambler *)&stack0xffffffffffffffac,in_R8D);
    C_00.n = in_RSI;
    C_00.ptr = in_stack_ffffffffffffffa8;
    local_4 = SampleGeneratorMatrix<pbrt::XORScrambler>
                        (C_00,(uint32_t)in_stack_ffffffffffffffa0,
                         (XORScrambler)(uint32_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  else {
    if (iVar1 != 3) {
      LogFatal(in_stack_00000044,in_stack_00000038,in_stack_00000034,in_stack_00000028);
    }
    OwenScrambler::OwenScrambler(local_6c,in_R8D);
    C_01.n = in_stack_ffffffffffffffb0;
    C_01.ptr = in_stack_ffffffffffffffa8;
    local_4 = SampleGeneratorMatrix<pbrt::OwenScrambler>
                        (C_01,(uint32_t)in_RDX,(OwenScrambler)(uint32_t)((ulong)in_RDX >> 0x20));
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float generateSample(pstd::span<const uint32_t> C, uint32_t a, uint32_t hash) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return SampleGeneratorMatrix(C, a, NoRandomizer());
        case RandomizeStrategy::Xor:
            return SampleGeneratorMatrix(C, a, XORScrambler(hash));
        case RandomizeStrategy::Owen:
            return SampleGeneratorMatrix(C, a, OwenScrambler(hash));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }